

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void test_ibuf_discard(void)

{
  char *pcVar1;
  size_t sVar2;
  char *pos;
  ibuf ibuf;
  
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_discard");
  ibuf_create((ibuf *)&pos,&cache,0x400);
  ibuf_alloc((ibuf *)&pos,0x200);
  pcVar1 = ibuf.buf;
  ibuf_discard((ibuf *)&pos,100);
  _ok((uint)(ibuf.buf == pcVar1),"ibuf.rpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x99,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 0x19c),"ibuf_used(&ibuf) == 412",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9a,
      "line %d");
  ibuf_discard((ibuf *)&pos,0x19c);
  _ok((uint)(ibuf.buf == pcVar1),"ibuf.rpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9c,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9d,
      "line %d");
  ibuf_destroy((ibuf *)&pos);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_discard");
  check_plan();
  return;
}

Assistant:

static void
test_ibuf_discard(void)
{
	plan(4);
	header();

	struct ibuf ibuf;
	ibuf_create(&ibuf, &cache, 1024);
	ibuf_alloc(&ibuf, 512);
	char *pos = ibuf.rpos;
	ibuf_discard(&ibuf, 100);
	ok(ibuf.rpos == pos);
	ok(ibuf_used(&ibuf) == 412);
	ibuf_discard(&ibuf, 412);
	ok(ibuf.rpos == pos);
	ok(ibuf_used(&ibuf) == 0);
	ibuf_destroy(&ibuf);

	footer();
	check_plan();
}